

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_generator.cc
# Opt level: O0

bool __thiscall re2::StringGenerator::IncrementDigits(StringGenerator *this)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  value_type_conflict local_20;
  int local_1c;
  StringGenerator *pSStack_18;
  int i;
  StringGenerator *this_local;
  
  pSStack_18 = this;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->digits_);
  local_1c = (int)sVar3;
  while( true ) {
    local_1c = local_1c + -1;
    if (local_1c < 0) {
      sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->digits_);
      bVar2 = (int)sVar3 < this->maxlen_;
      if (bVar2) {
        local_20 = 0;
        std::vector<int,_std::allocator<int>_>::push_back(&this->digits_,&local_20);
      }
      return bVar2;
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->digits_,(long)local_1c);
    iVar1 = *pvVar4;
    *pvVar4 = iVar1 + 1;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->alphabet_);
    if (iVar1 + 1 < (int)sVar3) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->digits_,(long)local_1c);
    *pvVar4 = 0;
  }
  return true;
}

Assistant:

bool StringGenerator::IncrementDigits() {
  // First try to increment the current number.
  for (int i = static_cast<int>(digits_.size()) - 1; i >= 0; i--) {
    if (++digits_[i] < static_cast<int>(alphabet_.size()))
      return true;
    digits_[i] = 0;
  }

  // If that failed, make a longer number.
  if (static_cast<int>(digits_.size()) < maxlen_) {
    digits_.push_back(0);
    return true;
  }

  return false;
}